

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::RegisterLazyBailout
          (ThreadContext *this,PropertyId propertyId,EntryPointInfo *entryPoint)

{
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  **ppWVar1;
  Recycler *pRVar2;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *pWVar3;
  TrackAllocData local_60;
  PropertyGuardEntry *local_38;
  PropertyGuardEntry *entry;
  PropertyRecord *pPStack_28;
  bool foundExistingGuard;
  PropertyRecord *propertyRecord;
  EntryPointInfo *entryPoint_local;
  ThreadContext *pTStack_10;
  PropertyId propertyId_local;
  ThreadContext *this_local;
  
  propertyRecord = (PropertyRecord *)entryPoint;
  entryPoint_local._4_4_ = propertyId;
  pTStack_10 = this;
  pPStack_28 = GetPropertyName(this,propertyId);
  local_38 = EnsurePropertyGuardEntry(this,pPStack_28,(bool *)((long)&entry + 7));
  ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WeaklyReferencedKeyDictionary__
                      ((WriteBarrierPtr *)&local_38->entryPoints);
  if (*ppWVar1 ==
      (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
       *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,
               (type_info *)
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0xdd4);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_60);
    pWVar3 = (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
              *)new<Memory::Recycler>(0x50,pRVar2,0x43c4b0);
    JsUtil::
    WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
    ::WeaklyReferencedKeyDictionary(pWVar3,this->recycler,3,(EntryRemovalCallback *)0x0);
    Memory::
    WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>_>
    ::operator=(&local_38->entryPoints,pWVar3);
  }
  pWVar3 = Memory::
           WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>_>
           ::operator->(&local_38->entryPoints);
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  ::UncheckedAdd(pWVar3,(EntryPointInfo *)propertyRecord,'\0');
  return;
}

Assistant:

void
ThreadContext::RegisterLazyBailout(Js::PropertyId propertyId, Js::EntryPointInfo* entryPoint)
{
    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;
    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);
    if (!entry->entryPoints)
    {
        entry->entryPoints = RecyclerNew(recycler, PropertyGuardEntry::EntryPointDictionary, recycler, /*capacity*/ 3);
    }
    entry->entryPoints->UncheckedAdd(entryPoint, NULL);
}